

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency.hpp
# Opt level: O1

string * __thiscall
duckdb::DependencySubjectFlags::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DependencySubjectFlags *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((this->super_DependencyFlags).value & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString() const override {
		string result;
		if (IsOwnership()) {
			result += "OWNS";
		}
		return result;
	}